

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t in_RAX;
  undefined7 extraout_var;
  int *piVar2;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (this->fd_ != (FILE *)0x0) {
    bVar1 = os::fwrite_bytes(*(void **)CONCAT44(in_register_00000034,__fd),
                             ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],this->fd_);
    in_RAX = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      os::filename_to_str(&local_30,&this->filename_);
      std::operator+(&local_50,"Failed writing to file ",&local_30);
      piVar2 = __errno_location();
      throw_spdlog_ex(&local_50,*piVar2);
    }
  }
  return in_RAX;
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf) {
    if (fd_ == nullptr) return;
    size_t msg_size = buf.size();
    auto data = buf.data();

    if (!details::os::fwrite_bytes(data, msg_size, fd_)) {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}